

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O1

void integer_suite::test_int32_minus_one(void)

{
  int value;
  value_type input [5];
  iarchive in;
  int local_b8 [2];
  uchar local_b0 [8];
  iarchive local_a8;
  
  local_b0[4] = 0xff;
  local_b0[0] = 0xc4;
  local_b0[1] = 0xff;
  local_b0[2] = 0xff;
  local_b0[3] = 0xff;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[5]>(&local_a8,(uchar (*) [5])local_b0)
  ;
  local_b8[0] = 99;
  trial::protocol::bintoken::iarchive::load<int>(&local_a8,local_b8);
  local_b8[1] = 0xffffffff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("value","-1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x95,"void integer_suite::test_int32_minus_one()",local_b8,local_b8 + 1);
  local_a8.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_0013dfc8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_a8 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_a8);
  return;
}

Assistant:

void test_int32_minus_one()
{
    const value_type input[] = { token::code::int32, 0xFF, 0xFF, 0xFF, 0xFF };
    format::iarchive in(input);
    int value = 99;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value, -1);
}